

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool IsValidSubDVertex(ON_SubDVertex *vertex,unsigned_short level,uint *vertex_id_range,
                      unsigned_short ordinary_valence_count,bool bSilentError)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  char cVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ON_Internal_DamagedMarker dm;
  ON_Internal_DamagedMarker local_10;
  
  cVar4 = (char)ordinary_valence_count;
  if (((vertex == (ON_SubDVertex *)0x0) || ((vertex->super_ON_SubDComponentBase).m_level != level))
     || ((vertex_id_range != (uint *)0x0 &&
         ((uVar3 = (vertex->super_ON_SubDComponentBase).m_id, uVar3 < *vertex_id_range ||
          (vertex_id_range[1] < uVar3)))))) {
    ON_SubDIncrementErrorCount();
    if (cVar4 != '\0') {
      return false;
    }
    bVar5 = ON_IsNotValid();
    return bVar5;
  }
  uVar1 = vertex->m_edge_count;
  uVar7 = (ulong)uVar1;
  uVar2 = vertex->m_face_count;
  uVar6 = (ulong)uVar2;
  local_10.m_subd_component = &vertex->super_ON_SubDComponentBase;
  if (uVar1 < uVar2) {
    if ((2 < uVar1) && (vertex->m_vertex_tag == Corner)) goto LAB_005ce8df;
    ON_SubDIncrementErrorCount();
  }
  else {
    if (uVar7 == 0) {
      bVar5 = true;
    }
    else {
LAB_005ce8df:
      if (vertex->m_edges == (ON_SubDEdgePtr *)0x0) {
        ON_SubDIncrementErrorCount();
        goto LAB_005ce9f4;
      }
      bVar5 = false;
    }
    if ((uVar6 == 0) || (vertex->m_faces != (ON_SubDFace **)0x0)) {
      switch(vertex->m_vertex_tag) {
      case Smooth:
        if (uVar1 == uVar2) {
LAB_005ce967:
          if (uVar7 != 0) goto LAB_005ce97b;
LAB_005ce995:
          if (uVar6 != 0) {
            uVar7 = 0;
            do {
              if ((uVar6 == uVar7) || (vertex->m_faces[uVar7] == (ON_SubDFace *)0x0)) {
                ON_SubDIncrementErrorCount();
                if (cVar4 != '\0') goto LAB_005ce9f8;
                bVar5 = ON_IsNotValid();
                goto LAB_005cea03;
              }
              uVar7 = uVar7 + 1;
            } while (uVar6 != uVar7);
          }
          local_10.m_subd_component = (ON_SubDComponentBase *)0x0;
          bVar5 = true;
          goto LAB_005cea03;
        }
        ON_SubDIncrementErrorCount();
        break;
      case Crease:
        if (1 < uVar1) {
LAB_005ce97b:
          uVar8 = 0;
          do {
            if ((uVar7 == uVar8) || (vertex->m_edges[uVar8].m_ptr < 8)) {
              ON_SubDIncrementErrorCount();
              if (cVar4 != '\0') goto LAB_005ce9f8;
              bVar5 = ON_IsNotValid();
              goto LAB_005cea03;
            }
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
          goto LAB_005ce995;
        }
        ON_SubDIncrementErrorCount();
        break;
      case Corner:
        if (!bVar5) goto LAB_005ce967;
        ON_SubDIncrementErrorCount();
        break;
      case Dart:
        if (uVar1 == 4 || level == 0) {
          if (uVar1 == uVar2) goto LAB_005ce967;
          ON_SubDIncrementErrorCount();
        }
        else {
          ON_SubDIncrementErrorCount();
        }
        break;
      default:
        ON_SubDIncrementErrorCount();
      }
    }
    else {
      ON_SubDIncrementErrorCount();
    }
  }
LAB_005ce9f4:
  if (cVar4 == '\0') {
    bVar5 = ON_IsNotValid();
  }
  else {
LAB_005ce9f8:
    bVar5 = false;
  }
LAB_005cea03:
  ON_Internal_DamagedMarker::~ON_Internal_DamagedMarker(&local_10);
  return bVar5;
}

Assistant:

static bool IsValidSubDVertex(
  const ON_SubDVertex* vertex,
  unsigned short level,
  unsigned int* vertex_id_range,
  unsigned short ordinary_valence_count,
  bool bSilentError
  )
{
  if (nullptr == vertex)
    return ON_SubDIsNotValid(bSilentError);
  
  if (vertex->SubdivisionLevel() != level)
    return ON_SubDIsNotValid(bSilentError);
  
  if (nullptr != vertex_id_range)
  {
    if (vertex->m_id < vertex_id_range[0])
      return ON_SubDIsNotValid(bSilentError);
    if (vertex->m_id > vertex_id_range[1])
      return ON_SubDIsNotValid(bSilentError);
  }

  ON_Internal_DamagedMarker dm(vertex);

  if (vertex->m_edge_count < vertex->m_face_count)
  {
    if ( ON_SubDVertexTag::Corner != vertex->m_vertex_tag || vertex->m_edge_count < 3 )
      return ON_SubDIsNotValid(bSilentError);
  }

  if (vertex->m_edge_count > 0 && nullptr == vertex->m_edges)
    return ON_SubDIsNotValid(bSilentError);

  if (vertex->m_face_count > 0 && nullptr == vertex->m_faces)
    return ON_SubDIsNotValid(bSilentError);

  switch (vertex->m_vertex_tag)
  {
  case ON_SubDVertexTag::Smooth: // interior vertex
    if (vertex->m_edge_count != vertex->m_face_count)
      return ON_SubDIsNotValid(bSilentError);
    break;

  case ON_SubDVertexTag::Crease:
    if ( vertex->m_edge_count < 2 )
      return ON_SubDIsNotValid(bSilentError);
    break;

  case ON_SubDVertexTag::Corner:
    if ( vertex->m_edge_count < 1 )
      return ON_SubDIsNotValid(bSilentError);
    break;

  case ON_SubDVertexTag::Dart: // interior vertex
    if (level > 0 && ordinary_valence_count != vertex->m_edge_count)
      return ON_SubDIsNotValid(bSilentError);
    if (vertex->m_edge_count != vertex->m_face_count)
      return ON_SubDIsNotValid(bSilentError);
    break;

  default:
    // invalid value for this enum
    return ON_SubDIsNotValid(bSilentError);
    break;
  }

  unsigned int count = vertex->m_edge_count;
  for (unsigned int i = 0; i < count; i++)
  {
    const ON_SubDEdge* edge = vertex->Edge(i);
    if (nullptr == edge)
      return ON_SubDIsNotValid(bSilentError);
  }

  count = vertex->m_face_count;
  for (unsigned int i = 0; i < count; i++)
  {
    const ON_SubDFace* face = vertex->Face(i);
    if (nullptr == face)
      return ON_SubDIsNotValid(bSilentError);
  }

  dm.ClearComponent();
  return true;
}